

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O2

void realloc_strcat(char **str,char *append)

{
  char *__s;
  size_t __n;
  size_t sVar1;
  char *__dest;
  int *piVar2;
  
  __s = *str;
  if (__s == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(__s);
  }
  sVar1 = strlen(append);
  __dest = (char *)malloc(__n + sVar1 + 1);
  if (__dest != (char *)0x0) {
    if (__s != (char *)0x0) {
      memcpy(__dest,__s,__n);
    }
    strcpy(__dest + __n,append);
    free(__s);
    *str = __dest;
    return;
  }
  piVar2 = __errno_location();
  lafe_errc(1,*piVar2,"Out of memory");
}

Assistant:

static void
realloc_strcat(char **str, const char *append)
{
	char *new_str;
	size_t old_len;

	if (*str == NULL)
		old_len = 0;
	else
		old_len = strlen(*str);

	new_str = malloc(old_len + strlen(append) + 1);
	if (new_str == NULL)
		lafe_errc(1, errno, "Out of memory");
	if (*str != NULL)
		memcpy(new_str, *str, old_len);
	strcpy(new_str + old_len, append);
	free(*str);
	*str = new_str;
}